

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

art_ref_t art_node256_erase(art_t *art,art_node256_t *node,uint8_t key_chunk)

{
  art_key_chunk_t *paVar1;
  art_ref_t aVar2;
  art_node48_t *node_00;
  byte in_DL;
  art_key_chunk_t *in_RSI;
  art_t *in_RDI;
  size_t i;
  art_node48_t *new_node;
  art_node_t *in_stack_ffffffffffffffc8;
  art_t *in_stack_ffffffffffffffd0;
  art_t *art_00;
  undefined7 in_stack_ffffffffffffffe0;
  art_t *in_stack_fffffffffffffff8;
  
  paVar1 = in_RSI + (ulong)in_DL * 8 + 8;
  paVar1[0] = '\0';
  paVar1[1] = '\0';
  paVar1[2] = '\0';
  paVar1[3] = '\0';
  paVar1[4] = '\0';
  paVar1[5] = '\0';
  paVar1[6] = '\0';
  paVar1[7] = '\0';
  *(short *)(in_RSI + 6) = *(short *)(in_RSI + 6) + -1;
  if (*(ushort *)(in_RSI + 6) < 0x31) {
    node_00 = art_node48_create(in_RDI,in_RSI,in_DL);
    for (art_00 = (art_t *)0x0; art_00 < (art_t *)0x100; art_00 = (art_t *)((long)&art_00->root + 1)
        ) {
      if (*(long *)(in_RSI + (long)art_00 * 8 + 8) != 0) {
        art_node48_insert(in_stack_fffffffffffffff8,(art_node48_t *)in_RDI,(art_ref_t)in_RSI,in_DL);
      }
    }
    art_node_free((art_t *)CONCAT17(in_DL,in_stack_ffffffffffffffe0),node_00,
                  (art_typecode_t)((ulong)art_00 >> 0x38));
    aVar2 = art_get_ref(art_00,in_stack_ffffffffffffffc8,'\0');
  }
  else {
    aVar2 = art_get_ref(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,'\0');
  }
  return aVar2;
}

Assistant:

static inline art_ref_t art_node256_erase(art_t *art, art_node256_t *node,
                                          uint8_t key_chunk) {
    node->children[key_chunk] = CROARING_ART_NULL_REF;
    node->count--;
    if (node->count > 48) {
        return art_get_ref(art, (art_node_t *)node, CROARING_ART_NODE256_TYPE);
    }

    art_node48_t *new_node =
        art_node48_create(art, node->base.prefix, node->base.prefix_size);
    for (size_t i = 0; i < 256; ++i) {
        if (node->children[i] != CROARING_ART_NULL_REF) {
            art_node48_insert(art, new_node, node->children[i], i);
        }
    }
    art_node_free(art, (art_node_t *)node, CROARING_ART_NODE256_TYPE);
    return art_get_ref(art, (art_node_t *)new_node, CROARING_ART_NODE48_TYPE);
}